

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

void flag_test(Parameters *params)

{
  size_t sVar1;
  ostream *poVar2;
  unique_ptr<unsigned_int,_void_(*)(void_*)> vals;
  
  sVar1 = params->items_count;
  poVar2 = std::operator<<((ostream *)&std::cerr,"Will test ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2," flags (");
  poVar2 = std::operator<<((ostream *)&std::cerr,"8 bit proc: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,"kB, ");
  poVar2 = std::operator<<((ostream *)&std::cerr,"16 bit proc: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,"kB, ");
  poVar2 = std::operator<<((ostream *)&std::cerr,"32-bit proc: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,"kB) repeated ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," times.");
  std::endl<char,std::char_traits<char>>(poVar2);
  vals._M_t.super___uniq_ptr_impl<unsigned_int,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_unsigned_int_*,_void_(*)(void_*)>.
  super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = (uint *)aligned_malloc(sVar1 * 4,0x40)
  ;
  vals._M_t.super___uniq_ptr_impl<unsigned_int,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_unsigned_int_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(void_*),_false>)aligned_free;
  benchmark(vals._M_t.super___uniq_ptr_impl<unsigned_int,_void_(*)(void_*)>._M_t.
            super__Tuple_impl<0UL,_unsigned_int_*,_void_(*)(void_*)>.
            super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl,params);
  std::unique_ptr<unsigned_int,_void_(*)(void_*)>::~unique_ptr(&vals);
  return;
}

Assistant:

void flag_test(const Parameters& params) {
    const size_t bytes  = params.items_count * sizeof(uint8_t);
    const size_t words  = params.items_count * sizeof(uint16_t);
    const size_t dwords = params.items_count * sizeof(uint32_t);
    std::ostream& out = std::cerr;

    out << "Will test " << params.items_count << " flags (";
    out << "8 bit proc: " << bytes / 1024 << "kB, ";
    out << "16 bit proc: " << words / 1024 << "kB, ";
    out << "32-bit proc: " << dwords / 1024 << "kB) repeated " << params.iterations << " times." << std::endl;

    std::unique_ptr<uint32_t, decltype(&aligned_free)> vals(
        static_cast<uint32_t*>(aligned_malloc(dwords, POSPOPCNT_SIMD_ALIGNMENT)),
        &aligned_free);
        
    benchmark(vals.get(), params);
}